

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_OpdatasetGetActive_Test::TestBody
          (InterpreterTestSuite_PC_OpdatasetGetActive_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  long *plVar2;
  bool bVar3;
  char *pcVar4;
  element_type *this_00;
  MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *this_01;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *pTVar5;
  char *pcVar6;
  reference this_02;
  AssertHelper local_830;
  Message local_828;
  allocator local_819;
  key_type local_818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7f8;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_7;
  AssertHelper local_7a8;
  Message local_7a0;
  bool local_791;
  undefined1 local_790 [8];
  AssertionResult gtest_ar__2;
  input_adapter local_760;
  undefined1 local_750 [8];
  json json;
  Message local_738;
  ErrorCode local_730;
  allocator local_729;
  string local_728;
  Error local_708;
  ErrorCode local_6dc;
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_6;
  string jsonStr;
  Message local_6a0;
  ErrorCode local_698;
  allocator local_691;
  string local_690;
  Error local_670;
  ErrorCode local_644;
  undefined1 local_640 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_610;
  Message local_608;
  bool local_5f9;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar__1;
  allocator local_599;
  string local_598;
  Expression local_578;
  AssertHelper local_560;
  Message local_558;
  int local_54c;
  undefined1 local_548 [8];
  AssertionResult gtest_ar_4;
  Message local_530;
  Status local_522;
  Status local_521;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_4f0;
  Message local_4e8;
  bool local_4d9;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar_;
  allocator local_479;
  string local_478;
  Expression local_458;
  undefined1 local_440 [8];
  Value value;
  Expression expr;
  ReturnAction<ot::commissioner::Error> local_3b8;
  anon_class_1_0_00000001_for_action local_3a2;
  testing local_3a1;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1907:42),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_3a0;
  Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  local_388;
  WithoutMatchers local_361;
  Matcher<unsigned_short> local_360;
  Matcher<ot::commissioner::ActiveOperationalDataset_&> local_348;
  MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  local_330;
  AssertHelper local_2f8;
  Message local_2f0;
  string local_2e8;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_2;
  Message local_2b0;
  Status local_2a2;
  Status local_2a1;
  undefined1 local_2a0 [8];
  AssertionResult gtest_ar_1;
  Network nwk;
  Message local_228;
  Status local_21a;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  DomainId local_1d0;
  NetworkId local_1cc;
  Network local_1c8;
  Status local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar;
  NetworkId nwk_id;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_OpdatasetGetActive_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  ot::commissioner::persistent_storage::NetworkId::NetworkId((NetworkId *)&gtest_ar.message_);
  plVar2 = *(long **)(ctx.mInterpreter._192_8_ + 8);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_1cc,0xffffffff);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_1d0,0xffffffff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f0,"",&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_218,"",&local_219);
  pcVar6 = (char *)0x0;
  ot::commissioner::persistent_storage::Network::Network
            (&local_1c8,&local_1cc,&local_1d0,&local_1f0,1,0,0,&local_218,0);
  local_161 = (**(code **)(*plVar2 + 0x30))(plVar2,&local_1c8,&gtest_ar.message_);
  local_21a = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
            ((EqHelper *)local_160,
             "ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, \"\", 1, 0, 0, \"\", 0}, nwk_id)"
             ,"PersistentStorage::Status::kSuccess",&local_161,&local_21a);
  ot::commissioner::persistent_storage::Network::~Network(&local_1c8);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator((allocator<char> *)&local_219);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar3) {
    testing::Message::Message(&local_228);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&nwk.mCcm,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&nwk.mCcm,&local_228);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&nwk.mCcm);
    testing::Message::~Message(&local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  ot::commissioner::persistent_storage::Network::Network((Network *)&gtest_ar_1.message_);
  local_2a1 = (**(code **)(**(long **)(ctx.mInterpreter._192_8_ + 8) + 0x70))
                        (*(long **)(ctx.mInterpreter._192_8_ + 8),&gtest_ar.message_,
                         &gtest_ar_1.message_);
  local_2a2 = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
            ((EqHelper *)local_2a0,"ctx.mRegistry->mStorage->Get(nwk_id, nwk)",
             "PersistentStorage::Status::kSuccess",&local_2a1,&local_2a2);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a0);
  if (!bVar3) {
    testing::Message::Message(&local_2b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a0);
  ot::commissioner::utils::Hex<unsigned_short>(&local_2e8,nwk.mXpan._4_2_);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[7],_nullptr>
            ((EqHelper *)local_2c8,"utils::Hex(nwk.mPan)","\"0x0000\"",&local_2e8,
             (char (*) [7])"0x0000");
  std::__cxx11::string::~string((string *)&local_2e8);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar3) {
    testing::Message::Message(&local_2f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x76f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  this_00 = std::__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&ctx.mRegistry);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_348,(AnythingMatcher *)&testing::_);
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_360,(AnythingMatcher *)&testing::_);
  CommissionerAppMock::gmock_GetActiveDataset(&local_330,this_00,&local_348,&local_360);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
            ::operator()(&local_330,&local_361,(void *)0x0);
  pcVar4 = "*ctx.mDefaultCommissionerObject";
  pTVar5 = testing::internal::
           MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
           ::InternalExpectedAt
                     (this_01,
                      "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                      ,0x771,"*ctx.mDefaultCommissionerObject","GetActiveDataset(_, _)");
  pTVar5 = testing::internal::
           TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
           ::Times(pTVar5,2);
  testing::WithArg<0ul,InterpreterTestSuite_PC_OpdatasetGetActive_Test::TestBody()::__0>(&local_3a2)
  ;
  ot::commissioner::Error::Error
            ((Error *)&expr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::Return<ot::commissioner::Error>
            ((testing *)&local_3b8,
             (Error *)&expr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::
  DoAll<testing::internal::WithArgsAction<InterpreterTestSuite_PC_OpdatasetGetActive_Test::TestBody()::__0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
            (&local_3a0,&local_3a1,
             (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_interpreter_test_cpp:1907:42),_0UL>
              *)&local_3b8,(ReturnAction<ot::commissioner::Error> *)pcVar4);
  testing::internal::DoAllAction::operator_cast_to_Action(&local_388,(DoAllAction *)&local_3a0);
  testing::internal::
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  ::WillRepeatedly(pTVar5,&local_388);
  testing::
  Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>::
  ~Action(&local_388);
  testing::internal::
  DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp:1907:42),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  ::~DoAllAction(&local_3a0);
  testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_3b8);
  ot::commissioner::Error::~Error
            ((Error *)&expr.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::
  MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>::
  ~MockSpec(&local_330);
  testing::Matcher<unsigned_short>::~Matcher(&local_360);
  testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>::~Matcher(&local_348);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_478,"opdataset get active",&local_479);
  ot::commissioner::Interpreter::ParseExpression(&local_458,(Interpreter *)local_140,&local_478);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_458);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_458);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=((Value *)local_440,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  local_4d9 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_440);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4d8,&local_4d9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar3) {
    testing::Message::Message(&local_4e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_4d8,(AssertionResult *)0x46a487,
               "false","true",pcVar6);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x780,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
    testing::internal::AssertHelper::~AssertHelper(&local_4f0);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_4e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  local_521 = (**(code **)(**(long **)(ctx.mInterpreter._192_8_ + 8) + 0x70))
                        (*(long **)(ctx.mInterpreter._192_8_ + 8),&gtest_ar.message_,
                         &gtest_ar_1.message_);
  local_522 = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
            ((EqHelper *)local_520,"ctx.mRegistry->mStorage->Get(nwk_id, nwk)",
             "PersistentStorage::Status::kSuccess",&local_521,&local_522);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
  if (!bVar3) {
    testing::Message::Message(&local_530);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x782,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_530);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_530);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
  local_54c = 1;
  testing::internal::EqHelper::Compare<unsigned_short,_int,_nullptr>
            ((EqHelper *)local_548,"nwk.mPan","0x0001",(unsigned_short *)((long)&nwk.mXpan + 4),
             &local_54c);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_548);
  if (!bVar3) {
    testing::Message::Message(&local_558);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_548);
    testing::internal::AssertHelper::AssertHelper
              (&local_560,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x783,pcVar4);
    testing::internal::AssertHelper::operator=(&local_560,&local_558);
    testing::internal::AssertHelper::~AssertHelper(&local_560);
    testing::Message::~Message(&local_558);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_548);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_598,"opdataset get active --export ./tmp/aods.json",&local_599);
  ot::commissioner::Interpreter::ParseExpression(&local_578,(Interpreter *)local_140,&local_598);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_578);
  std::__cxx11::string::~string((string *)&local_598);
  std::allocator<char>::~allocator((allocator<char> *)&local_599);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__1.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=((Value *)local_440,(Value *)&gtest_ar__1.message_)
  ;
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__1.message_);
  local_5f9 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_440);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_5f8,&local_5f9,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar3) {
    testing::Message::Message(&local_608);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_5.message_,(internal *)local_5f8,(AssertionResult *)0x46a487,
               "false","true",pcVar6);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_610,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x787,pcVar4);
    testing::internal::AssertHelper::operator=(&local_610,&local_608);
    testing::internal::AssertHelper::~AssertHelper(&local_610);
    std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  ot::commissioner::Interpreter::PrintOrExport((Interpreter *)local_140,(Value *)local_440);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_690,"./tmp/aods.json",&local_691);
  ot::commissioner::PathExists(&local_670,&local_690);
  local_644 = ot::commissioner::Error::GetCode(&local_670);
  local_698 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_640,"PathExists(\"./tmp/aods.json\").GetCode()","ErrorCode::kNone",
             &local_644,&local_698);
  ot::commissioner::Error::~Error(&local_670);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator((allocator<char> *)&local_691);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_640);
  if (!bVar3) {
    testing::Message::Message(&local_6a0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&jsonStr.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x789,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&jsonStr.field_2 + 8),&local_6a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&jsonStr.field_2 + 8));
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_640);
  std::__cxx11::string::string((string *)&gtest_ar_6.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_728,"./tmp/aods.json",&local_729);
  ot::commissioner::ReadFile(&local_708,(string *)&gtest_ar_6.message_,&local_728);
  local_6dc = ot::commissioner::Error::GetCode(&local_708);
  local_730 = kNone;
  testing::internal::EqHelper::
  Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
            ((EqHelper *)local_6d8,"ReadFile(jsonStr, \"./tmp/aods.json\").GetCode()",
             "ErrorCode::kNone",&local_6dc,&local_730);
  ot::commissioner::Error::~Error(&local_708);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator((allocator<char> *)&local_729);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar3) {
    testing::Message::Message(&local_738);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&json.m_value,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&json.m_value,&local_738);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&json.m_value);
    testing::Message::~Message(&local_738);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  nlohmann::detail::input_adapter::
  input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_760,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &gtest_ar_6.message_);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              *)&gtest_ar__2.message_,(nullptr_t)0x0);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           *)local_750,&local_760,(parser_callback_t *)&gtest_ar__2.message_,true);
  std::
  function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
  ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
               *)&gtest_ar__2.message_);
  nlohmann::detail::input_adapter::~input_adapter(&local_760);
  local_791 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::contains<const_char_(&)[6],_0>
                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_750,(char (*) [6])0x46ea62);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_790,&local_791,(type *)0x0);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_790);
  if (!bVar3) {
    testing::Message::Message(&local_7a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_7.message_,(internal *)local_790,
               (AssertionResult *)"json.contains(\"PanId\")","false","true",pcVar6);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_7a8,&local_7a0);
    testing::internal::AssertHelper::~AssertHelper(&local_7a8);
    std::__cxx11::string::~string((string *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_7a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_790);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_818,"PanId",&local_819);
  this_02 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)local_750,&local_818);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_7f8,this_02);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7d8,"\"0x0001\"","json.at(\"PanId\").get<std::string>().c_str()",
             "0x0001",pcVar6);
  std::__cxx11::string::~string((string *)&local_7f8);
  std::__cxx11::string::~string((string *)&local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  bVar3 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar3) {
    testing::Message::Message(&local_828);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x78f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_830,&local_828);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_750);
  std::__cxx11::string::~string((string *)&gtest_ar_6.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)local_440);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  ot::commissioner::persistent_storage::Network::~Network((Network *)&gtest_ar_1.message_);
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_OpdatasetGetActive)
{
    TestContext ctx;
    InitContext(ctx);

    NetworkId nwk_id;
    EXPECT_EQ(ctx.mRegistry->mStorage->Add(Network{EMPTY_ID, EMPTY_ID, "", 1, 0, 0, "", 0}, nwk_id),
              PersistentStorage::Status::kSuccess);
    Network nwk;
    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(utils::Hex(nwk.mPan), "0x0000");

    EXPECT_CALL(*ctx.mDefaultCommissionerObject, GetActiveDataset(_, _))
        .Times(2)
        .WillRepeatedly(DoAll(WithArg<0>([](ActiveOperationalDataset &a) {
                                  a.mExtendedPanId = ByteArray{0, 0, 0, 0, 0, 0, 0, 1};
                                  a.mPanId         = 1;
                                  a.mPresentFlags =
                                      ActiveOperationalDataset::kPanIdBit | ActiveOperationalDataset::kExtendedPanIdBit;
                              }),
                              Return(Error{})));

    Interpreter::Expression expr;
    Interpreter::Value      value;

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());

    EXPECT_EQ(ctx.mRegistry->mStorage->Get(nwk_id, nwk), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nwk.mPan, 0x0001);

    expr  = ctx.mInterpreter.ParseExpression("opdataset get active --export ./tmp/aods.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
    ctx.mInterpreter.PrintOrExport(value);
    EXPECT_EQ(PathExists("./tmp/aods.json").GetCode(), ErrorCode::kNone);

    std::string jsonStr;
    EXPECT_EQ(ReadFile(jsonStr, "./tmp/aods.json").GetCode(), ErrorCode::kNone);
    nlohmann::json json = nlohmann::json::parse(jsonStr);
    EXPECT_TRUE(json.contains("PanId"));
    EXPECT_STREQ("0x0001", json.at("PanId").get<std::string>().c_str());
}